

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

String * __thiscall
nigel::AstVariable::modelString_abi_cxx11_(String *__return_storage_ptr__,AstVariable *this)

{
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  AstVariable *local_18;
  AstVariable *this_local;
  
  local_18 = this;
  this_local = (AstVariable *)__return_storage_ptr__;
  if (*(int *)&(this->super_AstReturning).field_0x34 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"fast",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (*(int *)&(this->super_AstReturning).field_0x34 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"large",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (*(int *)&(this->super_AstReturning).field_0x34 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"stack",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (*(int *)&(this->super_AstReturning).field_0x34 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"heap",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (*(int *)&(this->super_AstReturning).field_0x34 == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"param",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-!-UNKNOWN-!-",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

String modelString()
		{
			if( model == MemModel::fast ) return "fast";
			else if( model == MemModel::large ) return "large";
			else if( model == MemModel::stack ) return "stack";
			else if( model == MemModel::heap ) return "heap";
			else if( model == MemModel::param ) return "param";
			else return "-!-UNKNOWN-!-";
		}